

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusPoly.cpp
# Opt level: O1

ModulusPoly * __thiscall
ZXing::Pdf417::ModulusPoly::add
          (ModulusPoly *__return_storage_ptr__,ModulusPoly *this,ModulusPoly *other)

{
  int *piVar1;
  pointer piVar2;
  ModulusGF *pMVar3;
  invalid_argument *this_00;
  ulong uVar4;
  int *piVar5;
  vector<int,_std::allocator<int>_> *__x;
  int iVar6;
  int iVar7;
  vector<int,_std::allocator<int>_> *pvVar8;
  size_t i;
  ulong uVar9;
  vector<int,_std::allocator<int>_> sumDiff;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> local_40;
  
  if (this->_field != other->_field) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"ModulusPolys do not have same ModulusGF field")
    ;
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar5 = (this->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    if (*piVar5 == 0) {
      __return_storage_ptr__->_field = other->_field;
      __x = &other->_coefficients;
    }
    else {
      piVar1 = (other->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((other->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish == piVar1) goto LAB_00175417;
      __x = &this->_coefficients;
      if (*piVar1 != 0) {
        pvVar8 = &other->_coefficients;
        if ((ulong)((long)(other->_coefficients).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) <
            (ulong)((long)(this->_coefficients).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)piVar5)) {
          pvVar8 = __x;
          __x = &other->_coefficients;
          other = this;
        }
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_40,
                   (long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(other->_coefficients).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2,&local_41);
        piVar2 = (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = ((long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)piVar2 >> 2) -
                ((long)(__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2);
        if (uVar9 != 0) {
          memmove(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,piVar2,uVar9 * 4);
        }
        piVar2 = (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = (long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
        if (uVar9 < uVar4) {
          pMVar3 = this->_field;
          piVar5 = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            iVar6 = piVar2[uVar9] + *piVar5;
            iVar7 = pMVar3->_modulus;
            if (iVar6 < iVar7) {
              iVar7 = 0;
            }
            local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar9] = iVar6 - iVar7;
            uVar9 = uVar9 + 1;
            piVar5 = piVar5 + 1;
          } while (uVar9 < uVar4);
        }
        ModulusPoly(__return_storage_ptr__,this->_field,&local_40);
        if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == (pointer)0x0) {
          return __return_storage_ptr__;
        }
        operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->_field = this->_field;
    }
    std::vector<int,_std::allocator<int>_>::vector(&__return_storage_ptr__->_coefficients,__x);
    return __return_storage_ptr__;
  }
LAB_00175417:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
}

Assistant:

ModulusPoly
ModulusPoly::add(const ModulusPoly& other) const
{
	if (_field != other._field) {
		throw std::invalid_argument("ModulusPolys do not have same ModulusGF field");
	}
	if (isZero()) {
		return other;
	}
	if (other.isZero()) {
		return *this;
	}

	auto smallerCoefficients = &_coefficients;
	auto largerCoefficients = &other._coefficients;
	if (smallerCoefficients->size() > largerCoefficients->size()) {
		std::swap(smallerCoefficients, largerCoefficients);
	}
	std::vector<int> sumDiff(largerCoefficients->size());
	size_t lengthDiff = largerCoefficients->size() - smallerCoefficients->size();

	// Copy high-order terms only found in higher-degree polynomial's coefficients
	std::copy_n(largerCoefficients->begin(), lengthDiff, sumDiff.begin());
	for (size_t i = lengthDiff; i < largerCoefficients->size(); i++) {
		sumDiff[i] = _field->add((*smallerCoefficients)[i - lengthDiff], (*largerCoefficients)[i]);
	}
	return ModulusPoly(*_field, sumDiff);
}